

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void anon_unknown.dwarf_1677::ndiGXHelper(ndicapi *pol,char *command,char *commandReply)

{
  bool bVar1;
  int local_40;
  int activeCount;
  int passiveCount;
  int k;
  int j;
  int i;
  char *writePointer;
  unsigned_long mode;
  char *commandReply_local;
  char *command_local;
  ndicapi *pol_local;
  
  writePointer = (char *)0x1;
  if (((command[2] == ':') && (command[7] != '\r')) || ((command[2] == ' ' && (command[3] != '\r')))
     ) {
    writePointer = (char *)ndiHexToUnsignedLong(command + 3,4);
  }
  mode = (unsigned_long)commandReply;
  if (((ulong)writePointer & 1) != 0) {
    for (activeCount = 0; activeCount < 3; activeCount = activeCount + 3) {
      for (k = 0; k < 3; k = k + 1) {
        passiveCount = 0;
        _j = pol->GxTransforms + k;
        while( true ) {
          bVar1 = false;
          if (passiveCount < 0x33) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*_j)[0] = *(char *)mode;
          passiveCount = passiveCount + 1;
          _j = (char (*) [52])(*_j + 1);
          mode = mode + 1;
        }
        (*_j)[0] = '\0';
        if (*(char *)mode == '\n') {
          mode = mode + 1;
        }
      }
      passiveCount = 0;
      _j = (char (*) [52])(pol->GxStatus + (activeCount / 3 << 3));
      while( true ) {
        bVar1 = false;
        if (passiveCount < 8) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*_j)[0] = *(char *)mode;
        passiveCount = passiveCount + 1;
        _j = (char (*) [52])((long)_j + 1);
        mode = mode + 1;
      }
    }
    if (*(char *)mode == '\n') {
      mode = mode + 1;
    }
  }
  if (((ulong)writePointer & 2) != 0) {
    for (k = 0; k < 3; k = k + 1) {
      passiveCount = 0;
      _j = (char (*) [52])(pol->GxInformation + k);
      while( true ) {
        bVar1 = false;
        if (passiveCount < 0xc) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*(char (*) [12])_j)[0] = *(char *)mode;
        passiveCount = passiveCount + 1;
        _j = (char (*) [52])(*(char (*) [12])_j + 1);
        mode = mode + 1;
      }
    }
    if (*(char *)mode == '\n') {
      mode = mode + 1;
    }
  }
  if (((ulong)writePointer & 4) != 0) {
    for (k = 0; k < 3; k = k + 1) {
      passiveCount = 0;
      _j = (char (*) [52])(pol->GxSingleStray + k);
      while( true ) {
        bVar1 = false;
        if (passiveCount < 0x15) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*(char (*) [24])_j)[0] = *(char *)mode;
        passiveCount = passiveCount + 1;
        _j = (char (*) [52])(*(char (*) [24])_j + 1);
        mode = mode + 1;
      }
      (*(char (*) [24])_j)[0] = '\0';
      if (*(char *)mode == '\n') {
        mode = mode + 1;
      }
    }
  }
  if (((ulong)writePointer & 8) != 0) {
    for (k = 0; k < 3; k = k + 1) {
      passiveCount = 0;
      _j = (char (*) [52])(pol->GxFrame + k);
      while( true ) {
        bVar1 = false;
        if (passiveCount < 8) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*(char (*) [8])_j)[0] = *(char *)mode;
        passiveCount = passiveCount + 1;
        _j = (char (*) [52])(*(char (*) [8])_j + 1);
        mode = mode + 1;
      }
    }
    if (*(char *)mode == '\n') {
      mode = mode + 1;
    }
  }
  if (((ulong)writePointer & 0x8000) != 0) {
    local_40 = 3;
    if (((ulong)writePointer & 0x2000) != 0) {
      local_40 = 9;
    }
    if ((((ulong)writePointer & 1) != 0) || (writePointer == (char *)0x8000)) {
      for (activeCount = 0; activeCount < local_40; activeCount = activeCount + 3) {
        for (k = 0; k < 3; k = k + 1) {
          passiveCount = 0;
          _j = pol->GxPassiveTransforms + (activeCount + k);
          while( true ) {
            bVar1 = false;
            if (passiveCount < 0x33) {
              bVar1 = '\x1f' < *(char *)mode;
            }
            if (!bVar1) break;
            (*_j)[0] = *(char *)mode;
            passiveCount = passiveCount + 1;
            _j = (char (*) [52])(*_j + 1);
            mode = mode + 1;
          }
          (*_j)[0] = '\0';
          if (*(char *)mode == '\n') {
            mode = mode + 1;
          }
        }
        passiveCount = 0;
        _j = (char (*) [52])(pol->GxPassiveStatus + (activeCount / 3 << 3));
        while( true ) {
          bVar1 = false;
          if (passiveCount < 8) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*_j)[0] = *(char *)mode;
          passiveCount = passiveCount + 1;
          _j = (char (*) [52])((long)_j + 1);
          mode = mode + 1;
        }
        if (*(char *)mode == '\n') {
          mode = mode + 1;
        }
        else {
          local_40 = activeCount + 3;
        }
      }
      if (*(char *)mode == '\n') {
        mode = mode + 1;
      }
    }
    if (((ulong)writePointer & 2) != 0) {
      for (k = 0; k < local_40; k = k + 1) {
        passiveCount = 0;
        _j = (char (*) [52])(pol->GxPassiveInformation + k);
        while( true ) {
          bVar1 = false;
          if (passiveCount < 0xc) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*(char (*) [12])_j)[0] = *(char *)mode;
          passiveCount = passiveCount + 1;
          _j = (char (*) [52])(*(char (*) [12])_j + 1);
          mode = mode + 1;
        }
      }
      if (*(char *)mode == '\n') {
        mode = mode + 1;
      }
    }
    if (((ulong)writePointer & 8) != 0) {
      for (k = 0; k < local_40; k = k + 1) {
        passiveCount = 0;
        _j = (char (*) [52])(pol->GxPassiveFrame + k);
        while( true ) {
          bVar1 = false;
          if (passiveCount < 8) {
            bVar1 = '\x1f' < *(char *)mode;
          }
          if (!bVar1) break;
          (*(char (*) [8])_j)[0] = *(char *)mode;
          passiveCount = passiveCount + 1;
          _j = (char (*) [52])(*(char (*) [8])_j + 1);
          mode = mode + 1;
        }
      }
      if (*(char *)mode == '\n') {
        mode = mode + 1;
      }
    }
    if (((ulong)writePointer & 0x1000) != 0) {
      passiveCount = 0;
      _j = (char (*) [52])pol->GxPassiveStray;
      while( true ) {
        bVar1 = false;
        if (passiveCount < 0x1a7) {
          bVar1 = '\x1f' < *(char *)mode;
        }
        if (!bVar1) break;
        (*_j)[0] = *(char *)mode;
        passiveCount = passiveCount + 1;
        _j = (char (*) [52])((long)_j + 1);
        mode = mode + 1;
      }
    }
  }
  return;
}

Assistant:

void ndiGXHelper(ndicapi* pol, const char* command, const char* commandReply)
  {
    unsigned long mode = NDI_XFORMS_AND_STATUS; // the default reply mode
    char* writePointer;
    int i, j, k;
    int passiveCount, activeCount;

    // if the GX command had a reply mode, read it
    if ((command[2] == ':' && command[7] != '\r') || (command[2] == ' ' && command[3] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[3], 4);
    }

    // always three active ports
    activeCount = 3;

    if (mode & NDI_XFORMS_AND_STATUS)
    {
      for (k = 0; k < activeCount; k += 3)
      {
        // grab the three transforms
        for (i = 0; i < 3; i++)
        {
          writePointer = pol->GxTransforms[i];
          for (j = 0; j < 51 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
          *writePointer = '\0';
          // eat the trailing newline
          if (*commandReply == '\n')
          {
            commandReply++;
          }
        }
        // grab the status flags
        writePointer = pol->GxStatus + k / 3 * 8;
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_ADDITIONAL_INFO)
    {
      // grab information for each port
      for (i = 0; i < activeCount; i++)
      {
        writePointer = pol->GxInformation[i];
        for (j = 0; j < 12 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_SINGLE_STRAY)
    {
      // grab stray marker for each port
      for (i = 0; i < activeCount; i++)
      {
        writePointer = pol->GxSingleStray[i];
        for (j = 0; j < 21 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        *writePointer = '\0';
        // eat the trailing newline
        if (*commandReply == '\n')
        {
          commandReply++;
        }
      }
    }

    if (mode & NDI_FRAME_NUMBER)
    {
      // get frame number for each port
      for (i = 0; i < activeCount; i++)
      {
        writePointer = pol->GxFrame[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    // if there is no passive information, stop here
    if (!(mode & NDI_PASSIVE))
    {
      return;
    }

    // in case there are 9 passive tools instead of just 3
    passiveCount = 3;
    if (mode & NDI_PASSIVE_EXTRA)
    {
      passiveCount = 9;
    }

    if ((mode & NDI_XFORMS_AND_STATUS) || (mode == NDI_PASSIVE))
    {
      // the information is grouped in threes
      for (k = 0; k < passiveCount; k += 3)
      {
        // grab the three transforms
        for (i = 0; i < 3; i++)
        {
          writePointer = pol->GxPassiveTransforms[k + i];
          for (j = 0; j < 51 && *commandReply >= ' '; j++)
          {
            *writePointer++ = *commandReply++;
          }
          *writePointer = '\0';
          // eat the trailing newline
          if (*commandReply == '\n')
          {
            commandReply++;
          }
        }
        // grab the status flags
        writePointer = pol->GxPassiveStatus + k / 3 * 8;
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
        // skip the newline
        if (*commandReply == '\n')
        {
          commandReply++;
        }
        else   // no newline: no more passive transforms
        {
          passiveCount = k + 3;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_ADDITIONAL_INFO)
    {
      // grab information for each port
      for (i = 0; i < passiveCount; i++)
      {
        writePointer = pol->GxPassiveInformation[i];
        for (j = 0; j < 12 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_FRAME_NUMBER)
    {
      // get frame number for each port
      for (i = 0; i < passiveCount; i++)
      {
        writePointer = pol->GxPassiveFrame[i];
        for (j = 0; j < 8 && *commandReply >= ' '; j++)
        {
          *writePointer++ = *commandReply++;
        }
      }
      // eat the trailing newline
      if (*commandReply == '\n')
      {
        commandReply++;
      }
    }

    if (mode & NDI_PASSIVE_STRAY)
    {
      // get all the passive stray information
      // this will be a maximum of 3 + 20*3*7 = 423 bytes
      writePointer = pol->GxPassiveStray;
      for (j = 0; j < 423 && *commandReply >= ' '; j++)
      {
        *writePointer++ = *commandReply++;
      }
    }
  }